

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O0

void Synthesizer::HandleEvent(EffectData *data,UInt32 msg,float sampletime)

{
  SynthesizerChannel *this;
  uint uVar1;
  uint note;
  uint velocity;
  SynthesizerChannel *synthchannel_1;
  int c;
  SynthesizerChannel *synthchannel;
  int data2;
  int data1;
  int command;
  int channel;
  float sampletime_local;
  UInt32 msg_local;
  EffectData *data_local;
  
  uVar1 = msg & 0xf0;
  note = msg >> 8 & 0xff;
  velocity = msg >> 0x10 & 0xff;
  this = data->synthchannel + (int)(msg & 0xf);
  if (uVar1 != 0x80) {
    if (uVar1 != 0x90) {
      if (uVar1 == 0xb0) {
        SynthesizerChannel::Control(this,note,velocity,data->p,sampletime);
        return;
      }
      if (uVar1 != 0xf0) {
        return;
      }
      if ((msg & 0xf) != 8) {
        return;
      }
      RingBuffer<8192,_MidiEvent>::Clear(&scheduledata);
      data->numpending = 0;
      memset(data->arpkeys,0,0x200);
      for (synthchannel_1._4_4_ = 0; synthchannel_1._4_4_ < 0x10;
          synthchannel_1._4_4_ = synthchannel_1._4_4_ + 1) {
        memset(data->synthchannel[synthchannel_1._4_4_].keys,0,0x400);
        data->synthchannel[synthchannel_1._4_4_].numvoices = 0;
      }
      return;
    }
    if (velocity != 0) {
      data->arpkeys[(int)note] = 1;
      SynthesizerChannel::NoteOn(this,note,velocity,data->p,sampletime);
      return;
    }
  }
  data->arpkeys[(int)note] = 0;
  SynthesizerChannel::NoteOff(this,note,velocity,data->p,sampletime);
  return;
}

Assistant:

static void HandleEvent(EffectData* data, UInt32 msg, float sampletime)
    {
        int channel = msg & 15;
        int command = msg & 0xF0;
        int data1 = (msg >> 8) & 255;
        int data2 = (msg >> 16) & 255;
        SynthesizerChannel* synthchannel = &data->synthchannel[channel];
        switch (command)
        {
            case 0x90:
                if (data2 > 0)
                {
                    data->arpkeys[data1] = 1;
                    synthchannel->NoteOn(data1, data2, data->p, sampletime);
                    break;
                }
            case 0x80:
                data->arpkeys[data1] = 0;
                synthchannel->NoteOff(data1, data2, data->p, sampletime);
                break;
            case 0xB0:
                synthchannel->Control(data1, data2, data->p, sampletime);
                break;
            case 0xF0:
                if (channel == 8)
                {
                    // All sound off
                    scheduledata.Clear();
                    data->numpending = 0;
                    memset(data->arpkeys, 0, sizeof(data->arpkeys));
                    for (int c = 0; c < 16; c++)
                    {
                        SynthesizerChannel* synthchannel = &data->synthchannel[c];
                        memset(synthchannel->keys, 0, sizeof(synthchannel->keys));
                        synthchannel->numvoices = 0;
                    }
                }
                break;
        }
    }